

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_namer.h
# Opt level: O3

string * __thiscall
flatbuffers::BfbsNamer::Field_abi_cxx11_(string *__return_storage_ptr__,BfbsNamer *this,Field *f)

{
  ulong uVar1;
  long *local_40 [2];
  long local_30 [2];
  
  uVar1 = (ulong)*(ushort *)(f + (4 - (long)*(int *)f));
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,f + (ulong)*(uint *)(f + uVar1) + 4 + uVar1,
             f + (ulong)*(uint *)(f + (ulong)*(uint *)(f + uVar1) + 4 + uVar1 + -4) +
                 *(uint *)(f + uVar1) + uVar1 + 4);
  (*(this->super_Namer)._vptr_Namer[0x12])(__return_storage_ptr__,this,(string *)local_40);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::string Field(const ::reflection::Field &f) const {
    return Field(f.name()->str());
  }